

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O2

void solveTSPRoute(Graph<std::pair<double,_double>_> *graph,UI *ui,int *start_node,int *end_node,
                  vector<int,_std::allocator<int>_> *POIs)

{
  double dVar1;
  ostream *poVar2;
  allocator local_35a;
  bool cancel;
  vector<int,_std::allocator<int>_> ord;
  Menu showMenu;
  _Any_data local_2f8;
  code *local_2e8;
  code *pcStack_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  function<Path_()> tsp_algorithm;
  Path path;
  Menu algorithmSelector;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  tsp_algorithm.super__Function_base._M_manager = (_Manager_type)0x0;
  tsp_algorithm._M_invoker = (_Invoker_type)0x0;
  tsp_algorithm.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  tsp_algorithm.super__Function_base._M_functor._8_8_ = 0;
  Path::Path(&path);
  ord.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ord.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ord.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cancel = false;
  std::__cxx11::string::string((string *)&local_b8,"Select algorithm",(allocator *)&showMenu);
  Menu::Menu(&algorithmSelector,&local_b8,false);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_d8,"Cancel",(allocator *)&showMenu);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = &cancel;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:77:43)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:77:43)>
             ::_M_manager;
  Menu::addOption(&algorithmSelector,&local_d8,(function<void_()> *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_f8,"Nearest-neighbor",(allocator *)&showMenu);
  local_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_278._M_unused._M_object = operator_new(0x38);
  *(function<Path_()> **)local_278._M_unused._0_8_ = &tsp_algorithm;
  *(Graph<std::pair<double,_double>_> **)((long)local_278._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_278._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_278._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_278._M_unused._0_8_ + 0x20) = POIs;
  *(vector<int,_std::allocator<int>_> **)((long)local_278._M_unused._0_8_ + 0x28) = &ord;
  *(Path **)((long)local_278._M_unused._0_8_ + 0x30) = &path;
  pcStack_260 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:78:53)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:78:53)>
              ::_M_manager;
  Menu::addOption(&algorithmSelector,&local_f8,(function<void_()> *)&local_278);
  std::_Function_base::~_Function_base((_Function_base *)&local_278);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string((string *)&local_118,"Nearest-neighbor 2-opt",(allocator *)&showMenu)
  ;
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_298._M_unused._M_object = operator_new(0x38);
  *(function<Path_()> **)local_298._M_unused._0_8_ = &tsp_algorithm;
  *(Graph<std::pair<double,_double>_> **)((long)local_298._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_298._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_298._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_298._M_unused._0_8_ + 0x20) = POIs;
  *(vector<int,_std::allocator<int>_> **)((long)local_298._M_unused._0_8_ + 0x28) = &ord;
  *(Path **)((long)local_298._M_unused._0_8_ + 0x30) = &path;
  pcStack_280 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:79:59)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:79:59)>
              ::_M_manager;
  Menu::addOption(&algorithmSelector,&local_118,(function<void_()> *)&local_298);
  std::_Function_base::~_Function_base((_Function_base *)&local_298);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_138,"Randomized NN",(allocator *)&showMenu);
  local_2a8 = (code *)0x0;
  pcStack_2a0 = (code *)0x0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2b8._M_unused._M_object = operator_new(0x38);
  *(function<Path_()> **)local_2b8._M_unused._0_8_ = &tsp_algorithm;
  *(Graph<std::pair<double,_double>_> **)((long)local_2b8._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_2b8._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_2b8._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_2b8._M_unused._0_8_ + 0x20) = POIs;
  *(vector<int,_std::allocator<int>_> **)((long)local_2b8._M_unused._0_8_ + 0x28) = &ord;
  *(Path **)((long)local_2b8._M_unused._0_8_ + 0x30) = &path;
  pcStack_2a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:80:50)>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:80:50)>
              ::_M_manager;
  Menu::addOption(&algorithmSelector,&local_138,(function<void_()> *)&local_2b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string((string *)&local_158,"Randomized NN 2-opt",(allocator *)&showMenu);
  local_2c8 = (code *)0x0;
  pcStack_2c0 = (code *)0x0;
  local_2d8._M_unused._M_object = (void *)0x0;
  local_2d8._8_8_ = 0;
  local_2d8._M_unused._M_object = operator_new(0x38);
  *(function<Path_()> **)local_2d8._M_unused._0_8_ = &tsp_algorithm;
  *(Graph<std::pair<double,_double>_> **)((long)local_2d8._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_2d8._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_2d8._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_2d8._M_unused._0_8_ + 0x20) = POIs;
  *(vector<int,_std::allocator<int>_> **)((long)local_2d8._M_unused._0_8_ + 0x28) = &ord;
  *(Path **)((long)local_2d8._M_unused._0_8_ + 0x30) = &path;
  pcStack_2c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:81:56)>
                ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:81:56)>
              ::_M_manager;
  Menu::addOption(&algorithmSelector,&local_158,(function<void_()> *)&local_2d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_158);
  Menu::start(&algorithmSelector);
  if (cancel == false) {
    std::chrono::_V2::system_clock::now();
    std::function<Path_()>::operator()((Path *)&showMenu,&tsp_algorithm);
    Path::operator=(&path,(Path *)&showMenu);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&showMenu.name._M_string_length);
    std::chrono::_V2::system_clock::now();
    std::operator<<((ostream *)&std::cout,"Size: ");
    dVar1 = Path::getLength(&path);
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Time to pathfind (micro): ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&local_178,"Show path?",&local_35a);
    Menu::Menu(&showMenu,&local_178,false);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string((string *)&local_198,"No",&local_35a);
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:94:30)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:94:30)>
               ::_M_manager;
    Menu::addOption(&showMenu,&local_198,(function<void_()> *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string((string *)&local_1b8,"Yes, in GraphViewer",&local_35a);
    local_2e8 = (code *)0x0;
    pcStack_2e0 = (code *)0x0;
    local_2f8._M_unused._M_object = (void *)0x0;
    local_2f8._8_8_ = 0;
    local_2f8._M_unused._M_object = operator_new(0x18);
    *(UI **)local_2f8._M_unused._0_8_ = ui;
    *(Path **)((long)local_2f8._M_unused._0_8_ + 8) = &path;
    *(vector<int,_std::allocator<int>_> **)((long)local_2f8._M_unused._0_8_ + 0x10) = &ord;
    pcStack_2e0 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:95:47)>
                  ::_M_invoke;
    local_2e8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:95:47)>
                ::_M_manager;
    Menu::addOption(&showMenu,&local_1b8,(function<void_()> *)&local_2f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::string((string *)&local_1d8,"Yes, in console",&local_35a);
    local_70._8_8_ = 0;
    local_70._M_unused._M_object = &ord;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:96:43)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:96:43)>
               ::_M_manager;
    Menu::addOption(&showMenu,&local_1d8,(function<void_()> *)&local_70);
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
    std::__cxx11::string::~string((string *)&local_1d8);
    Menu::start(&showMenu);
    Menu::~Menu(&showMenu);
  }
  Menu::~Menu(&algorithmSelector);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ord.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&path.path.super__Vector_base<int,_std::allocator<int>_>);
  std::_Function_base::~_Function_base(&tsp_algorithm.super__Function_base);
  return;
}

Assistant:

void solveTSPRoute(Graph<coordinates> &graph, UI &ui, const int &start_node, const int &end_node, vector<int> &POIs) {
    function<Path ()> tsp_algorithm;
    Path path;
    vector<int> ord;
    bool cancel = false;

    Menu algorithmSelector("Select algorithm", false);
    algorithmSelector.addOption("Cancel", [&](){ cancel = true; });
    algorithmSelector.addOption("Nearest-neighbor", [&](){ tsp_algorithm = [&](){ return graph.nearestNeighborsSearch(start_node, end_node, POIs, ord, path); }; });
    algorithmSelector.addOption("Nearest-neighbor 2-opt", [&](){ tsp_algorithm = [&](){ graph.nearestNeighborsSearch(start_node, end_node, POIs, ord, path); return graph.twoOpt(ord, path); }; });
    algorithmSelector.addOption("Randomized NN", [&](){ tsp_algorithm = [&](){ return graph.RNNeighborsSearch(start_node, end_node, POIs, ord, path, 3); }; });
    algorithmSelector.addOption("Randomized NN 2-opt", [&](){ tsp_algorithm = [&](){ graph.RNNeighborsSearch(start_node, end_node, POIs, ord, path, 3); return graph.twoOpt(ord, path); }; });
    algorithmSelector.start();
    if (cancel) { return; }

    auto start = high_resolution_clock::now();
    path = tsp_algorithm();
    auto stop = high_resolution_clock::now();
    auto duration = duration_cast<microseconds>(stop - start);

    cout << "Size: " << path.getLength() << endl;
    cout << "Time to pathfind (micro): " << duration.count() << endl;

    Menu showMenu("Show path?", false);
    showMenu.addOption("No", EXIT);
    showMenu.addOption("Yes, in GraphViewer", [&](){ ui.showDeliveryPath(path.getPath(), ord); });
    showMenu.addOption("Yes, in console", [&](){ printPath(ord); enterWait(); });
    showMenu.start();
}